

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O3

GLboolean __thiscall
glcts::TextureBufferOperations::verifyResults
          (TextureBufferOperations *this,GLint *reference,GLint *result,GLuint size,char *message)

{
  GLboolean GVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  stringstream referenceData;
  stringstream resultData;
  long *local_500;
  long local_4f8;
  long local_4f0 [2];
  long *local_4e0;
  long local_4d8;
  long local_4d0 [2];
  stringstream local_4c0 [16];
  undefined1 local_4b0 [376];
  undefined1 local_338 [8];
  _func_int **local_330;
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  iVar2 = bcmp(reference,result,(ulong)size);
  if (iVar2 == 0) {
    GVar1 = '\x01';
  }
  else {
    std::__cxx11::stringstream::stringstream(local_4c0);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"[",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
    if (3 < size) {
      uVar5 = 0;
      do {
        poVar3 = (ostream *)std::ostream::operator<<(local_4b0,reference[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,result[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
        uVar5 = uVar5 + 1;
      } while (size >> 2 != uVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
    local_338 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    if (message == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_330 + (int)local_330[-3]);
    }
    else {
      sVar4 = strlen(message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,message,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"Result buffer contains different data than reference buffer\n"
               ,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"Reference Buffer: ",0x12);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,(char *)local_4e0,local_4d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"Result Buffer: ",0xf);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,(char *)local_500,local_4f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_500 != local_4f0) {
      operator_delete(local_500,local_4f0[0] + 1);
    }
    if (local_4e0 != local_4d0) {
      operator_delete(local_4e0,local_4d0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
    std::ios_base::~ios_base(local_2c0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::__cxx11::stringstream::~stringstream(local_4c0);
    std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x70));
    GVar1 = '\0';
  }
  return GVar1;
}

Assistant:

glw::GLboolean TextureBufferOperations::verifyResults(glw::GLint* reference, glw::GLint* result, glw::GLuint size,
													  const char* message)
{
	/* Log error if expected and result data is not equal */
	if (memcmp(reference, result, size))
	{
		std::stringstream referenceData;
		std::stringstream resultData;

		referenceData << "[";
		resultData << "[";

		glw::GLuint n_entries = static_cast<glw::GLuint>(size / sizeof(glw::GLint));

		for (glw::GLuint i = 0; i < n_entries; ++i)
		{
			referenceData << reference[i] << ",";
			resultData << result[i] << ",";
		}

		referenceData << "]";
		resultData << "]";

		m_testCtx.getLog() << tcu::TestLog::Message << message
						   << "Result buffer contains different data than reference buffer\n"
						   << "Reference Buffer: " << referenceData.str() << "\n"
						   << "Result Buffer: " << resultData.str() << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}